

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r4.h
# Opt level: O0

int sort_5_4::merge_1(int *a,int mid,int low,int high)

{
  code *pcVar1;
  long local_48;
  int local_40;
  int local_3c;
  int k_1;
  int k;
  unsigned_long __vla_expr0;
  int local_24;
  int local_20;
  int j;
  int i;
  int high_local;
  int low_local;
  int mid_local;
  int *a_local;
  
  __vla_expr0 = (unsigned_long)&local_48;
  local_24 = mid + 1;
  _k_1 = (ulong)(uint)(high - low);
  local_48 = (long)&local_48 - (_k_1 * 4 + 0xf & 0xfffffffffffffff0);
  for (local_3c = low; local_40 = low, local_20 = low, local_3c <= high; local_3c = local_3c + 1) {
    *(int *)(local_48 + (long)(local_3c - low) * 4) = a[local_3c];
  }
  for (; local_40 <= high; local_40 = local_40 + 1) {
    if (mid < local_20) {
      a[local_40] = *(int *)(local_48 + (long)(local_24 - low) * 4);
      local_24 = local_24 + 1;
    }
    else if (high < local_24) {
      a[local_40] = *(int *)(local_48 + (long)(local_20 - low) * 4);
      local_20 = local_20 + 1;
    }
    else if (*(int *)(local_48 + (long)(local_24 - low) * 4) <
             *(int *)(local_48 + (long)(local_20 - low) * 4)) {
      a[local_40] = *(int *)(local_48 + (long)(local_24 - low) * 4);
      local_24 = local_24 + 1;
    }
    else {
      a[local_40] = *(int *)(local_48 + (long)(local_20 - low) * 4);
      local_20 = local_20 + 1;
    }
  }
  pcVar1 = (code *)invalidInstructionException();
  j = high;
  i = low;
  high_local = mid;
  _low_local = a;
  (*pcVar1)();
}

Assistant:

int merge_1(int *a, int mid, int low, int high) {
        int i = low, j = mid + 1, t[high - low];
        for (int k = low; k <= high; k++)
            t[k - low] = a[k];

        for (int k = low; k <= high; k++) {
            if (i > mid) {
                a[k] = t[j - low];
                j++;
            } else if (j > high) {
                a[k] = t[i - low];
                i++;
            } else if (t[i - low] > t[j - low]) {
                a[k] = t[j - low];
                j++;
            } else {
                a[k] = t[i - low];
                i++;
            }
        }

    }